

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void OnRPCStarted(void)

{
  function<void_(SynchronizationState,_const_CBlockIndex_*)> fn;
  undefined8 *puVar1;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  _Manager_type p_Var2;
  code *pcVar3;
  connection local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (_Manager_type)0x0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = RPCNotifyBlockChange;
  pcVar3 = std::
           _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_std::_Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)>_>
           ::_M_manager;
  fn.super__Function_base._M_functor._8_8_ = puVar1;
  fn.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffffb8;
  fn.super__Function_base._M_manager = p_Var2;
  fn._M_invoker =
       std::
       _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_std::_Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)>_>
       ::_M_manager;
  CClientUIInterface::NotifyBlockTip_connect((CClientUIInterface *)&local_20,fn);
  boost::signals2::connection::operator=(&rpc_notify_block_change_connection,&local_20);
  boost::detail::weak_count::~weak_count(&local_20._weak_connection_body.pn);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffffc0,&stack0xffffffffffffffc0,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void OnRPCStarted()
{
    rpc_notify_block_change_connection = uiInterface.NotifyBlockTip_connect(std::bind(RPCNotifyBlockChange, std::placeholders::_2));
}